

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void UYVYToUV422Row_SSE2(uint8_t *src_uyvy,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  byte bVar3;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [15];
  byte bVar20;
  int iVar21;
  long lVar22;
  undefined4 uVar23;
  undefined1 auVar29 [16];
  ushort uVar30;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar31 [16];
  ushort uVar38;
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  uint8_t *src_uyvy_local;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined6 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [14];
  undefined1 auVar28 [15];
  
  lVar22 = (long)dst_v - (long)dst_u;
  do {
    auVar29 = *(undefined1 (*) [16])src_uyvy;
    pauVar1 = (undefined1 (*) [16])((long)src_uyvy + 0x10);
    src_uyvy = (uint8_t *)((long)src_uyvy + 0x20);
    auVar18[8] = 0xff;
    auVar18._0_8_ = 0xff00ff00ff00ff;
    auVar18[9] = 0;
    auVar18[10] = 0xff;
    auVar18[0xb] = 0;
    auVar18[0xc] = 0xff;
    auVar18[0xd] = 0;
    auVar18[0xe] = 0xff;
    auVar18[0xf] = 0;
    auVar29 = auVar29 & auVar18;
    auVar31[8] = 0xff;
    auVar31._0_8_ = 0xff00ff00ff00ff;
    auVar31[9] = 0;
    auVar31[10] = 0xff;
    auVar31[0xb] = 0;
    auVar31[0xc] = 0xff;
    auVar31[0xd] = 0;
    auVar31[0xe] = 0xff;
    auVar31[0xf] = 0;
    auVar31 = *pauVar1 & auVar31;
    uVar11 = auVar29._0_2_;
    uVar12 = auVar29._2_2_;
    bVar3 = (uVar12 != 0) * (uVar12 < 0x100) * auVar29[2] - (0xff < uVar12);
    uVar12 = auVar29._4_2_;
    uVar13 = auVar29._6_2_;
    cVar4 = (uVar13 != 0) * (uVar13 < 0x100) * auVar29[6] - (0xff < uVar13);
    uVar23 = CONCAT13(cVar4,CONCAT12((uVar12 != 0) * (uVar12 < 0x100) * auVar29[4] - (0xff < uVar12)
                                     ,CONCAT11(bVar3,(uVar11 != 0) * (uVar11 < 0x100) * auVar29[0] -
                                                     (0xff < uVar11))));
    sVar15 = auVar29._8_2_;
    sVar16 = auVar29._10_2_;
    cVar5 = (0 < sVar16) * (sVar16 < 0x100) * auVar29[10] - (0xff < sVar16);
    uVar24 = CONCAT15(cVar5,CONCAT14((0 < sVar15) * (sVar15 < 0x100) * auVar29[8] - (0xff < sVar15),
                                     uVar23));
    sVar15 = auVar29._12_2_;
    sVar16 = auVar29._14_2_;
    cVar6 = (0 < sVar16) * (sVar16 < 0x100) * auVar29[0xe] - (0xff < sVar16);
    uVar25 = CONCAT17(cVar6,CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar29[0xc] -
                                     (0xff < sVar15),uVar24));
    uVar11 = auVar31._0_2_;
    uVar12 = auVar31._2_2_;
    cVar7 = (uVar12 != 0) * (uVar12 < 0x100) * auVar31[2] - (0xff < uVar12);
    auVar26._0_10_ =
         CONCAT19(cVar7,CONCAT18((uVar11 != 0) * (uVar11 < 0x100) * auVar31[0] - (0xff < uVar11),
                                 uVar25));
    uVar11 = auVar31._4_2_;
    auVar26[10] = (uVar11 != 0) * (uVar11 < 0x100) * auVar31[4] - (0xff < uVar11);
    uVar11 = auVar31._6_2_;
    cVar8 = (uVar11 != 0) * (uVar11 < 0x100) * auVar31[6] - (0xff < uVar11);
    auVar26[0xb] = cVar8;
    sVar15 = auVar31._8_2_;
    auVar27[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar31[8] - (0xff < sVar15);
    auVar27._0_12_ = auVar26;
    sVar15 = auVar31._10_2_;
    cVar9 = (0 < sVar15) * (sVar15 < 0x100) * auVar31[10] - (0xff < sVar15);
    auVar27[0xd] = cVar9;
    sVar15 = auVar31._12_2_;
    auVar28[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar31[0xc] - (0xff < sVar15);
    auVar28._0_14_ = auVar27;
    sVar15 = auVar31._14_2_;
    cVar10 = (0 < sVar15) * (sVar15 < 0x100) * auVar31[0xe] - (0xff < sVar15);
    auVar29[0xf] = cVar10;
    auVar29._0_15_ = auVar28;
    auVar19[8] = 0xff;
    auVar19._0_8_ = 0xff00ff00ff00ff;
    auVar19[9] = 0;
    auVar19[10] = 0xff;
    auVar19[0xb] = 0;
    auVar19[0xc] = 0xff;
    auVar19[0xd] = 0;
    auVar19[0xe] = 0xff;
    auVar28 = auVar28 & auVar19;
    uVar11 = auVar28._0_2_;
    uVar12 = auVar28._2_2_;
    uVar13 = auVar28._4_2_;
    uVar14 = auVar28._6_2_;
    sVar15 = auVar28._8_2_;
    sVar16 = auVar28._10_2_;
    sVar17 = auVar28._12_2_;
    bVar20 = auVar28[0xe];
    uVar30 = (ushort)bVar3;
    uVar32 = (ushort)((uint)uVar23 >> 0x18);
    uVar33 = (ushort)((uint6)uVar24 >> 0x28);
    uVar34 = (ushort)((ulong)uVar25 >> 0x38);
    uVar35 = (ushort)((unkuint10)auVar26._0_10_ >> 0x48);
    uVar36 = auVar26._10_2_ >> 8;
    uVar37 = auVar27._12_2_ >> 8;
    uVar38 = auVar29._14_2_ >> 8;
    *(ulong *)dst_u =
         CONCAT17((bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20),
                  CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar28[0xc] - (0xff < sVar17),
                           CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar28[10] - (0xff < sVar16),
                                    CONCAT14((0 < sVar15) * (sVar15 < 0x100) * auVar28[8] -
                                             (0xff < sVar15),
                                             CONCAT13((uVar14 != 0) * (uVar14 < 0x100) * auVar28[6]
                                                      - (0xff < uVar14),
                                                      CONCAT12((uVar13 != 0) * (uVar13 < 0x100) *
                                                               auVar28[4] - (0xff < uVar13),
                                                               CONCAT11((uVar12 != 0) *
                                                                        (uVar12 < 0x100) *
                                                                        auVar28[2] - (0xff < uVar12)
                                                                        ,(uVar11 != 0) *
                                                                         (uVar11 < 0x100) *
                                                                         auVar28[0] -
                                                                         (0xff < uVar11))))))));
    *(ulong *)(dst_u + lVar22) =
         CONCAT17((uVar38 != 0) * (uVar38 < 0x100) * cVar10 - (0xff < uVar38),
                  CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * cVar9 - (0xff < uVar37),
                           CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * cVar8 - (0xff < uVar36),
                                    CONCAT14((uVar35 != 0) * (uVar35 < 0x100) * cVar7 -
                                             (0xff < uVar35),
                                             CONCAT13((uVar34 != 0) * (uVar34 < 0x100) * cVar6 -
                                                      (0xff < uVar34),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               cVar5 - (0xff < uVar33),
                                                               CONCAT11((uVar32 != 0) *
                                                                        (uVar32 < 0x100) * cVar4 -
                                                                        (0xff < uVar32),
                                                                        (uVar30 != 0) *
                                                                        (uVar30 < 0x100) * bVar3 -
                                                                        (0xff < uVar30))))))));
    dst_u = dst_u + 8;
    iVar21 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar21;
  } while (iVar21 != 0 && bVar2);
  return;
}

Assistant:

void UYVYToUV422Row_SSE2(const uint8_t* src_uyvy,
                         uint8_t* dst_u,
                         uint8_t* dst_v,
                         int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrlw       $0x8,%%xmm5                   \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "movq        %%xmm1,0x00(%1,%2,1)          \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_uyvy),  // %0
        "+r"(dst_u),     // %1
        "+r"(dst_v),     // %2
        "+r"(width)      // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}